

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
decrement_leaf_count
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          size_t leaf_size)

{
  atomic_array<node_type_counter_array> *paVar1;
  __int_type_conflict _Var2;
  
  decrease_memory_use(this,leaf_size);
  LOCK();
  paVar1 = &this->node_counts;
  _Var2 = paVar1->_M_elems[0].super___atomic_base<unsigned_long>._M_i;
  paVar1->_M_elems[0].super___atomic_base<unsigned_long>._M_i =
       paVar1->_M_elems[0].super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  if (_Var2 != 0) {
    return;
  }
  __assert_fail("old_leaf_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x325,
                "void unodb::olc_db<unsigned long, std::span<const std::byte>>::decrement_leaf_count(std::size_t) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void decrement_leaf_count(std::size_t leaf_size) noexcept {
    decrease_memory_use(leaf_size);

    const auto old_leaf_count UNODB_DETAIL_USED_IN_DEBUG =
        node_counts[as_i<node_type::LEAF>].fetch_sub(1,
                                                     std::memory_order_relaxed);
    UNODB_DETAIL_ASSERT(old_leaf_count > 0);
  }